

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

void __thiscall
vkt::texture::util::TextureBinding::TextureBinding
          (TextureBinding *this,Context *context,TestTextureSp *textureData,Type type)

{
  this->m_context = context;
  this->m_type = type;
  de::SharedPtr<vkt::pipeline::TestTexture>::SharedPtr(&this->m_textureData,textureData);
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = 0;
  (this->m_textureImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_textureImageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  updateTextureData(this,&this->m_textureData,this->m_type);
  return;
}

Assistant:

TextureBinding::TextureBinding (Context& context, const TestTextureSp& textureData, const TextureBinding::Type type)
	: m_context			(context)
	, m_type			(type)
	, m_textureData		(textureData)
{
	updateTextureData(m_textureData, m_type);
}